

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::anon_unknown_5::FindPureFunctions::operator()(FindPureFunctions *this,UnaryExpr *node)

{
  long *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::Expression,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             &(node->operand).
              super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*local_20 + 0x18))(local_20,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void operator()(const ast::UnaryExpr &node) const override {
    visit(node.operand);
  }